

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

int __thiscall ncnn::Extractor::extract(Extractor *this,char *blob_name,Mat *feat,int type)

{
  int iVar1;
  int local_1c;
  
  iVar1 = Net::find_blob_index_by_name(this->d->net,blob_name);
  if (iVar1 != -1) {
    iVar1 = extract(this,iVar1,feat,type);
    return iVar1;
  }
  extract();
  return local_1c;
}

Assistant:

int Extractor::extract(const char* blob_name, Mat& feat, int type)
{
    int blob_index = d->net->find_blob_index_by_name(blob_name);
    if (blob_index == -1)
    {
        NCNN_LOGE("Try");
        const std::vector<const char*>& output_names = d->net->output_names();
        for (size_t i = 0; i < output_names.size(); i++)
        {
            NCNN_LOGE("    ex.extract(\"%s\", out%d);", output_names[i], (int)i);
        }

        return -1;
    }

    return extract(blob_index, feat, type);
}